

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3_174.c
# Opt level: O0

Bit8u OPL3_EnvelopeCalcRate(opl3_slot_conflict *slot,Bit8u reg_rate)

{
  Bit8u local_24;
  byte local_1a;
  Bit8u rate;
  Bit8u reg_rate_local;
  opl3_slot_conflict *slot_local;
  
  if (reg_rate == '\0') {
    slot_local._7_1_ = 0;
  }
  else {
    if (slot->reg_ksr == '\0') {
      local_24 = (Bit8u)((int)(uint)slot->channel->ksv >> 2);
    }
    else {
      local_24 = slot->channel->ksv;
    }
    local_1a = reg_rate * '\x04' + local_24;
    if (0x3c < local_1a) {
      local_1a = 0x3c;
    }
    slot_local._7_1_ = local_1a;
  }
  return slot_local._7_1_;
}

Assistant:

static Bit8u OPL3_EnvelopeCalcRate(opl3_slot *slot, Bit8u reg_rate)
{
    Bit8u rate;
    if (reg_rate == 0x00)
    {
        return 0x00;
    }
    rate = (reg_rate << 2)
         + (slot->reg_ksr ? slot->channel->ksv : (slot->channel->ksv >> 2));
    if (rate > 0x3c)
    {
        rate = 0x3c;
    }
    return rate;
}